

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# version_set.cc
# Opt level: O0

bool __thiscall leveldb::Compaction::ShouldStopBefore(Compaction *this,Slice *internal_key)

{
  ulong uVar1;
  long lVar2;
  bool bVar3;
  long *plVar4;
  undefined8 uVar5;
  int iVar6;
  size_type sVar7;
  reference ppFVar8;
  int64_t iVar9;
  undefined8 in_RSI;
  long in_RDI;
  InternalKeyComparator *icmp;
  VersionSet *vset;
  Slice local_38;
  long *local_28;
  long local_20;
  undefined8 local_18;
  
  local_20 = **(long **)(in_RDI + 0x10);
  local_28 = (long *)(local_20 + 0x38);
  local_18 = in_RSI;
  while( true ) {
    uVar1 = *(ulong *)(in_RDI + 0x108);
    sVar7 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::size
                      ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                       (in_RDI + 0xf0));
    uVar5 = local_18;
    plVar4 = local_28;
    bVar3 = false;
    if (uVar1 < sVar7) {
      std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::operator[]
                ((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_> *)
                 (in_RDI + 0xf0),*(size_type *)(in_RDI + 0x108));
      local_38 = InternalKey::Encode((InternalKey *)0x12daed);
      iVar6 = (**(code **)(*plVar4 + 0x10))(plVar4,uVar5,&local_38);
      bVar3 = 0 < iVar6;
    }
    if (!bVar3) break;
    if ((*(byte *)(in_RDI + 0x110) & 1) != 0) {
      ppFVar8 = std::vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>::
                operator[]((vector<leveldb::FileMetaData_*,_std::allocator<leveldb::FileMetaData_*>_>
                            *)(in_RDI + 0xf0),*(size_type *)(in_RDI + 0x108));
      *(uint64_t *)(in_RDI + 0x118) = (*ppFVar8)->file_size + *(long *)(in_RDI + 0x118);
    }
    *(long *)(in_RDI + 0x108) = *(long *)(in_RDI + 0x108) + 1;
  }
  *(undefined1 *)(in_RDI + 0x110) = 1;
  lVar2 = *(long *)(in_RDI + 0x118);
  iVar9 = MaxGrandParentOverlapBytes((Options *)0x12dba7);
  bVar3 = iVar9 < lVar2;
  if (bVar3) {
    *(undefined8 *)(in_RDI + 0x118) = 0;
  }
  return bVar3;
}

Assistant:

bool Compaction::ShouldStopBefore(const Slice& internal_key) {
  const VersionSet* vset = input_version_->vset_;
  // Scan to find earliest grandparent file that contains key.
  const InternalKeyComparator* icmp = &vset->icmp_;
  while (grandparent_index_ < grandparents_.size() &&
         icmp->Compare(internal_key,
                       grandparents_[grandparent_index_]->largest.Encode()) >
             0) {
    if (seen_key_) {
      overlapped_bytes_ += grandparents_[grandparent_index_]->file_size;
    }
    grandparent_index_++;
  }
  seen_key_ = true;

  if (overlapped_bytes_ > MaxGrandParentOverlapBytes(vset->options_)) {
    // Too much overlap for current output; start new output
    overlapped_bytes_ = 0;
    return true;
  } else {
    return false;
  }
}